

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> * __thiscall
timing_registry::collectChildren
          (vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
           *__return_storage_ptr__,timing_registry *this,
          vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *children,
          double *totalDuration)

{
  bool bVar1;
  size_type __n;
  pointer ppVar2;
  reference pptVar3;
  uint64_t local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false> local_70;
  value_type local_68;
  reference local_60;
  task_handle *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *__range1;
  double *totalDuration_local;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *children_local;
  timing_registry *this_local;
  vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> *infos;
  
  std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::vector
            (__return_storage_ptr__);
  __n = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::size(children);
  std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::reserve
            (__return_storage_ptr__,__n);
  *totalDuration = 0.0;
  __end1 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::begin(children);
  c = (task_handle *)
      std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::end(children);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
                                     *)&c), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
               ::operator*(&__end1);
    local_78 = oqpi::task_handle::getUID(local_60);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
         ::find(&this->tasks,&local_78);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
                           *)&local_70);
    local_68 = &ppVar2->second;
    std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::
    push_back(__return_storage_ptr__,&local_68);
    pptVar3 = std::
              vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::
              back(__return_storage_ptr__);
    *totalDuration = (*pptVar3)->duration_ + *totalDuration;
    __gnu_cxx::
    __normal_iterator<const_oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<task_info*> collectChildren(const std::vector<oqpi::task_handle> &children, double &totalDuration)
    {
        std::vector<task_info*> infos;
        infos.reserve(children.size());
        totalDuration = 0;
        for (auto &c : children)
        {
            infos.push_back(&tasks.find(c.getUID())->second);
            totalDuration += infos.back()->duration_;
        }
        return infos;
    }